

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.c
# Opt level: O0

int noise_segment_mix(mixed_segment *segment)

{
  float fVar1;
  uint local_38;
  uint32_t local_34;
  uint32_t i;
  uint32_t samples;
  float *out;
  code *pcStack_20;
  float volume;
  _func_float_noise_segment_data_ptr *noise;
  noise_segment_data *data;
  mixed_segment *segment_local;
  
  noise = (_func_float_noise_segment_data_ptr *)segment->data;
  pcStack_20 = *(code **)(noise + 8);
  out._4_4_ = *(float *)(noise + 0x10);
  local_34 = 0xffffffff;
  data = (noise_segment_data *)segment;
  mixed_buffer_request_write((float **)&i,&local_34,*(mixed_buffer **)noise);
  for (local_38 = 0; local_38 < local_34; local_38 = local_38 + 1) {
    fVar1 = (float)(*pcStack_20)(noise);
    _i[local_38] = fVar1 * out._4_4_;
  }
  mixed_buffer_finish_write(local_34,*(mixed_buffer **)noise);
  return 1;
}

Assistant:

int noise_segment_mix(struct mixed_segment *segment){
  struct noise_segment_data *data = (struct noise_segment_data *)segment->data;

  float (*noise)(struct noise_segment_data *data) = data->type;
  float volume = data->volume;
  float *restrict out;
  uint32_t samples = UINT32_MAX;
  mixed_buffer_request_write(&out, &samples, data->out);
  for(uint32_t i=0; i<samples; ++i){
    out[i] = noise(data) * volume;
  }
  mixed_buffer_finish_write(samples, data->out);
  return 1;
}